

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O3

VirtualIterator<Kernel::TypedTermList> __thiscall
Kernel::EqHelper::getRewritableVarsIterator
          (EqHelper *this,DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *unstableVars,
          Literal *lit,Ordering *ord)

{
  Result RVar1;
  TermList *pTVar2;
  undefined8 *puVar3;
  RewritableVarsIt *this_00;
  Stack<Kernel::TypedTermList> local_278;
  size_t local_258;
  TypedTermList *pTStack_250;
  TypedTermList *local_248;
  TypedTermList *pTStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  long local_228;
  size_t local_218;
  TypedTermList *pTStack_210;
  TypedTermList *local_208;
  TypedTermList *pTStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  long local_1e8;
  RewritableVarsIt local_1e0;
  IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
  local_180;
  RewritableVarsIt local_e8;
  RewritableVarsIt local_88;
  
  RVar1 = Ordering::getEqualityArgumentOrder(ord,lit);
  switch(RVar1) {
  case GREATER:
  case EQUAL:
    pTVar2 = (lit->super_Term)._args + (*(uint *)&(lit->super_Term).field_0xc & 0xfffffff);
    break;
  case LESS:
    pTVar2 = (lit->super_Term)._args +
             ((ulong)(*(uint *)&(lit->super_Term).field_0xc & 0xfffffff) - 1);
    break;
  case INCOMPARABLE:
    RewritableVarsIt::RewritableVarsIt(&local_88,unstableVars,&lit->super_Term,false);
    Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&local_1e0,&local_88);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              (&local_180,(IterTraits<Kernel::RewritableVarsIt> *)&local_1e0);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::collect<Lib::Stack>(&local_278,&local_180);
    local_1e8 = (long)local_278._cursor - (long)local_278._stack >> 4;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_218 = local_278._capacity;
    local_208 = local_278._cursor;
    pTStack_200 = local_278._end;
    pTStack_210 = local_278._stack;
    puVar3 = (undefined8 *)::operator_new(0x48,8);
    local_208 = (TypedTermList *)0x0;
    pTStack_200 = (TypedTermList *)0x0;
    local_218 = 0;
    pTStack_210 = (TypedTermList *)0x0;
    puVar3[8] = local_1e8;
    puVar3[6] = local_1f8;
    puVar3[7] = uStack_1f0;
    *puVar3 = &PTR__ProxyIterator_00b3b438;
    puVar3[2] = local_278._capacity;
    puVar3[4] = local_278._cursor;
    puVar3[5] = local_278._end;
    puVar3[3] = local_278._stack;
    *(undefined8 **)this = puVar3;
    *(undefined4 *)(puVar3 + 1) = 1;
    RewritableVarsIt::~RewritableVarsIt(&local_180._iter._iter._inn);
    Lib::Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash>::clear
              ((Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *)&local_180);
    RewritableVarsIt::~RewritableVarsIt(&local_1e0);
    this_00 = &local_88;
    goto LAB_0051c646;
  default:
    goto switchD_0051c3e5_default;
  }
  if (((ulong)pTVar2->_content & 3) == 0) {
    RewritableVarsIt::RewritableVarsIt(&local_e8,unstableVars,(Term *)pTVar2->_content,true);
    Lib::iterTraits<Kernel::RewritableVarsIt>
              ((IterTraits<Kernel::RewritableVarsIt> *)&local_1e0,&local_e8);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique
              (&local_180,(IterTraits<Kernel::RewritableVarsIt> *)&local_1e0);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::collect<Lib::Stack>(&local_278,&local_180);
    local_228 = (long)local_278._cursor - (long)local_278._stack >> 4;
    local_238 = 0;
    uStack_230 = 0;
    local_258 = local_278._capacity;
    local_248 = local_278._cursor;
    pTStack_240 = local_278._end;
    pTStack_250 = local_278._stack;
    puVar3 = (undefined8 *)::operator_new(0x48,8);
    local_248 = (TypedTermList *)0x0;
    pTStack_240 = (TypedTermList *)0x0;
    local_258 = 0;
    pTStack_250 = (TypedTermList *)0x0;
    puVar3[8] = local_228;
    puVar3[6] = local_238;
    puVar3[7] = uStack_230;
    *puVar3 = &PTR__ProxyIterator_00b3b438;
    puVar3[2] = local_278._capacity;
    puVar3[4] = local_278._cursor;
    puVar3[5] = local_278._end;
    puVar3[3] = local_278._stack;
    *(undefined8 **)this = puVar3;
    *(undefined4 *)(puVar3 + 1) = 1;
    RewritableVarsIt::~RewritableVarsIt(&local_180._iter._iter._inn);
    Lib::Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash>::clear
              ((Map<Kernel::TypedTermList,_std::tuple<>,_Lib::DefaultHash> *)&local_180);
    RewritableVarsIt::~RewritableVarsIt(&local_1e0);
    this_00 = &local_e8;
LAB_0051c646:
    RewritableVarsIt::~RewritableVarsIt(this_00);
  }
  else {
switchD_0051c3e5_default:
    Lib::VirtualIterator<Kernel::TypedTermList>::getEmpty();
  }
  return (VirtualIterator<Kernel::TypedTermList>)(IteratorCore<Kernel::TypedTermList> *)this;
}

Assistant:

VirtualIterator<TypedTermList> EqHelper::getRewritableVarsIterator(DHSet<unsigned>* unstableVars, Literal* lit, const Ordering& ord)
{
  ASS(lit->isEquality());
    
  TermList sel;
  switch(ord.getEqualityArgumentOrder(lit)) {
  case Ordering::INCOMPARABLE: {
    return pvi(iterTraits(RewritableVarsIt(unstableVars, lit))
      .unique()
      .persistent());
  }
  case Ordering::EQUAL:
  case Ordering::GREATER:
    sel=*lit->nthArgument(0);
    break;
  case Ordering::LESS:
    sel=*lit->nthArgument(1);
    break;
#if VDEBUG
  default:
    ASSERTION_VIOLATION;
#endif
  }
  if (!sel.isTerm()) {
    return VirtualIterator<TypedTermList>::getEmpty();
  }
  return pvi(iterTraits(RewritableVarsIt(unstableVars, sel.term(), true)).unique().persistent());
}